

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls_record.cc
# Opt level: O0

uint16_t bssl::tls_record_version(SSL *ssl)

{
  uint16_t uVar1;
  SSL *ssl_local;
  
  if (ssl->s3->version == 0) {
    ssl_local._6_2_ = 0x301;
  }
  else {
    uVar1 = ssl_protocol_version(ssl);
    if (uVar1 < 0x304) {
      ssl_local._6_2_ = ssl->s3->version;
    }
    else {
      ssl_local._6_2_ = 0x303;
    }
  }
  return ssl_local._6_2_;
}

Assistant:

static uint16_t tls_record_version(const SSL *ssl) {
  if (ssl->s3->version == 0) {
    // Before the version is determined, outgoing records use TLS 1.0 for
    // historical compatibility requirements.
    return TLS1_VERSION;
  }

  // TLS 1.3 freezes the record version at TLS 1.2. Previous ones use the
  // version itself.
  return ssl_protocol_version(ssl) >= TLS1_3_VERSION ? TLS1_2_VERSION
                                                     : ssl->s3->version;
}